

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall
server_context::send_rerank(server_context *this,server_slot *slot,llama_batch *batch)

{
  long *plVar1;
  common_log *pcVar2;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  int __flags;
  char *in_R8;
  ulong uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  long *local_40;
  ulong local_38;
  
  plVar1 = (long *)operator_new(0x20);
  __flags = (int)in_R8;
  plVar1[2] = 0;
  plVar1[3] = 0;
  *(undefined4 *)((long)plVar1 + 0xc) = 0xffffffff;
  *plVar1 = (long)&PTR_is_error_002d8e18;
  *(undefined4 *)((long)plVar1 + 0x14) = 0xc9742400;
  *(int *)(plVar1 + 1) = slot->id_task;
  *(int *)(plVar1 + 2) = (int)slot->index;
  *(int32_t *)(plVar1 + 3) = slot->n_prompt_tokens;
  __buf = extraout_RDX;
  if (0 < batch->n_tokens) {
    uVar3 = 0;
    do {
      if ((batch->logits[uVar3] != '\0') && (*batch->seq_id[uVar3] == slot->id)) {
        auVar5 = llama_get_embeddings_seq(this->ctx);
        if (auVar5._0_8_ == 0) {
          auVar5 = llama_get_embeddings_ith(this->ctx,uVar3 & 0xffffffff);
          __buf = auVar5._8_8_;
          if (auVar5._0_8_ != 0) goto LAB_0019960f;
          uVar4 = 0xc9742400;
          if (-1 < common_log_verbosity_thold) {
            pcVar2 = common_log_main();
            local_38 = (ulong)(uint)slot->id_task;
            in_RCX = 0xc;
            in_R8 = "send_rerank";
            common_log_add(pcVar2,GGML_LOG_LEVEL_ERROR,
                           "slot %12.*s: id %2d | task %d | failed to get embeddings, token = %d, seq_id = %d\n"
                           ,0xc,"send_rerank",(ulong)(uint)slot->id,local_38,
                           (ulong)(uint)batch->token[uVar3],(ulong)(uint)*batch->seq_id[uVar3]);
            uVar4 = 0xc9742400;
            __buf = extraout_RDX_00;
          }
        }
        else {
LAB_0019960f:
          __buf = auVar5._8_8_;
          uVar4 = *auVar5._0_8_;
        }
        *(undefined4 *)((long)plVar1 + 0x14) = uVar4;
      }
      __flags = (int)in_R8;
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)batch->n_tokens);
  }
  if (0 < common_log_verbosity_thold) {
    pcVar2 = common_log_main();
    __flags = 0x276a9d;
    in_RCX = 0xc;
    common_log_add(pcVar2,GGML_LOG_LEVEL_DEBUG,
                   "slot %12.*s: id %2d | task %d | sending rerank result, res.score = %f\n",
                   SUB84((double)*(float *)((long)plVar1 + 0x14),0),0xc,"send_rerank",
                   (ulong)(uint)slot->id,(ulong)(uint)slot->id_task);
    __buf = extraout_RDX_01;
  }
  local_40 = plVar1;
  server_response::send(&this->queue_results,(int)&local_40,__buf,in_RCX,__flags);
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 0x28))();
  }
  return;
}

Assistant:

void send_rerank(const server_slot & slot, const llama_batch & batch) {
        auto res = std::make_unique<server_task_result_rerank>();
        res->id    = slot.id_task;
        res->index = slot.index;
        res->n_tokens = slot.n_prompt_tokens;

        for (int i = 0; i < batch.n_tokens; ++i) {
            if (!batch.logits[i] || batch.seq_id[i][0] != slot.id) {
                continue;
            }

            const float * embd = llama_get_embeddings_seq(ctx, batch.seq_id[i][0]);
            if (embd == NULL) {
                embd = llama_get_embeddings_ith(ctx, i);
            }

            if (embd == NULL) {
                SLT_ERR(slot, "failed to get embeddings, token = %d, seq_id = %d\n", batch.token[i], batch.seq_id[i][0]);

                res->score = -1e6;
                continue;
            }

            res->score = embd[0];
        }

        SLT_DBG(slot, "sending rerank result, res.score = %f\n", res->score);

        queue_results.send(std::move(res));
    }